

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall
IntrusiveListIteratorTest_crbegin_crend_backward_Test::
~IntrusiveListIteratorTest_crbegin_crend_backward_Test
          (IntrusiveListIteratorTest_crbegin_crend_backward_Test *this)

{
  IntrusiveListIteratorTest_crbegin_crend_backward_Test *this_local;
  
  ~IntrusiveListIteratorTest_crbegin_crend_backward_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(IntrusiveListIteratorTest, crbegin_crend_backward) {
  TestBackward(list_.crbegin(), list_.crend(), {1, 2, 3});
  TestBackward(clist_.crbegin(), clist_.crend(), {1, 2, 3});
}